

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCooperativeMatrixLengthNV
          (ValidationState_t *state,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint uVar3;
  char *__s;
  DiagnosticStream *pDVar4;
  string local_670;
  DiagnosticStream local_650;
  string local_478;
  DiagnosticStream local_458;
  Instruction *local_280;
  Instruction *type;
  byte local_26d;
  uint type_id;
  undefined1 local_268 [3];
  bool isKhr;
  DiagnosticStream local_248;
  Instruction *local_70;
  Instruction *result_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string instr_name;
  Instruction *inst_local;
  ValidationState_t *state_local;
  
  instr_name.field_2._8_8_ = inst;
  OVar1 = val::Instruction::opcode((Instruction *)inst);
  __s = spvOpcodeString(OVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,__s,(allocator<char> *)((long)&result_type + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"Op",
                 &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result_type + 7));
  uVar2 = val::Instruction::type_id((Instruction *)instr_name.field_2._8_8_);
  local_70 = ValidationState_t::FindDef(state,uVar2);
  OVar1 = val::Instruction::opcode(local_70);
  if (OVar1 == OpTypeInt) {
    uVar3 = val::Instruction::GetOperandAs<unsigned_int>(local_70,1);
    if (uVar3 == 0x20) {
      uVar3 = val::Instruction::GetOperandAs<unsigned_int>(local_70,2);
      if (uVar3 == 0) {
        OVar1 = val::Instruction::opcode((Instruction *)instr_name.field_2._8_8_);
        local_26d = OVar1 == OpCooperativeMatrixLengthKHR;
        type._4_4_ = val::Instruction::GetOperandAs<unsigned_int>
                               ((Instruction *)instr_name.field_2._8_8_,2);
        local_280 = ValidationState_t::FindDef(state,type._4_4_);
        if ((local_26d & 1) != 0) {
          OVar1 = val::Instruction::opcode(local_280);
          if (OVar1 != OpTypeCooperativeMatrixKHR) {
            ValidationState_t::diag
                      (&local_458,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_
                      );
            pDVar4 = DiagnosticStream::operator<<(&local_458,(char (*) [13])"The type in ");
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_40);
            pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [7])0xd2734c);
            ValidationState_t::getIdName_abi_cxx11_(&local_478,state,type._4_4_);
            pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_478);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [37])" must be OpTypeCooperativeMatrixKHR.");
            state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            std::__cxx11::string::~string((string *)&local_478);
            DiagnosticStream::~DiagnosticStream(&local_458);
            goto LAB_00bb3b71;
          }
        }
        if ((local_26d & 1) == 0) {
          OVar1 = val::Instruction::opcode(local_280);
          if (OVar1 != OpTypeCooperativeMatrixNV) {
            ValidationState_t::diag
                      (&local_650,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_
                      );
            pDVar4 = DiagnosticStream::operator<<(&local_650,(char (*) [13])"The type in ");
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_40);
            pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [7])0xd2734c);
            ValidationState_t::getIdName_abi_cxx11_(&local_670,state,type._4_4_);
            pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_670);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [36])" must be OpTypeCooperativeMatrixNV.");
            state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            std::__cxx11::string::~string((string *)&local_670);
            DiagnosticStream::~DiagnosticStream(&local_650);
            goto LAB_00bb3b71;
          }
        }
        state_local._4_4_ = SPV_SUCCESS;
        goto LAB_00bb3b71;
      }
    }
  }
  ValidationState_t::diag
            (&local_248,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
  pDVar4 = DiagnosticStream::operator<<(&local_248,(char (*) [20])"The Result Type of ");
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
  pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [7])0xd2734c);
  uVar2 = val::Instruction::id((Instruction *)instr_name.field_2._8_8_);
  ValidationState_t::getIdName_abi_cxx11_((string *)local_268,state,uVar2);
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_268);
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(char (*) [51])" must be OpTypeInt with width 32 and signedness 0.");
  state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  std::__cxx11::string::~string((string *)local_268);
  DiagnosticStream::~DiagnosticStream(&local_248);
LAB_00bb3b71:
  type_id = 1;
  std::__cxx11::string::~string((string *)local_40);
  return state_local._4_4_;
}

Assistant:

spv_result_t ValidateCooperativeMatrixLengthNV(ValidationState_t& state,
                                               const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  // Result type must be a 32-bit unsigned int.
  auto result_type = state.FindDef(inst->type_id());
  if (result_type->opcode() != spv::Op::OpTypeInt ||
      result_type->GetOperandAs<uint32_t>(1) != 32 ||
      result_type->GetOperandAs<uint32_t>(2) != 0) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Result Type of " << instr_name << " <id> "
           << state.getIdName(inst->id())
           << " must be OpTypeInt with width 32 and signedness 0.";
  }

  bool isKhr = inst->opcode() == spv::Op::OpCooperativeMatrixLengthKHR;
  auto type_id = inst->GetOperandAs<uint32_t>(2);
  auto type = state.FindDef(type_id);
  if (isKhr && type->opcode() != spv::Op::OpTypeCooperativeMatrixKHR) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The type in " << instr_name << " <id> "
           << state.getIdName(type_id)
           << " must be OpTypeCooperativeMatrixKHR.";
  } else if (!isKhr && type->opcode() != spv::Op::OpTypeCooperativeMatrixNV) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The type in " << instr_name << " <id> "
           << state.getIdName(type_id) << " must be OpTypeCooperativeMatrixNV.";
  }
  return SPV_SUCCESS;
}